

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix3f.cpp
# Opt level: O3

Matrix3f * __thiscall
Matrix3f::inverse(Matrix3f *__return_storage_ptr__,Matrix3f *this,bool *pbIsSingular,float epsilon)

{
  float m00;
  float m00_00;
  float m01;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Dc;
  uint extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  uint extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  uint extraout_XMM0_Dc_04;
  uint extraout_XMM0_Dc_05;
  undefined4 extraout_XMM0_Dd;
  uint extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  uint extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  uint extraout_XMM0_Dd_04;
  uint extraout_XMM0_Dd_05;
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  
  fVar15 = this->m_elements[0];
  fVar14 = this->m_elements[4];
  fVar11 = this->m_elements[5];
  fVar13 = this->m_elements[7];
  fVar10 = this->m_elements[8];
  m00 = this->m_elements[1];
  fVar12 = this->m_elements[2];
  m00_00 = this->m_elements[3];
  m01 = this->m_elements[6];
  fVar6 = Matrix2f::determinant2x2(fVar14,fVar13,fVar11,fVar10);
  fVar7 = Matrix2f::determinant2x2(m00,fVar13,fVar12,fVar10);
  fVar8 = Matrix2f::determinant2x2(m00,fVar14,fVar12,fVar11);
  fVar9 = Matrix2f::determinant2x2(m00_00,m01,fVar11,fVar10);
  fVar10 = Matrix2f::determinant2x2(fVar15,m01,fVar12,fVar10);
  fVar11 = Matrix2f::determinant2x2(fVar15,m00_00,fVar12,fVar11);
  fVar12 = Matrix2f::determinant2x2(m00_00,m01,fVar14,fVar13);
  fVar13 = Matrix2f::determinant2x2(fVar15,m01,m00,fVar13);
  fVar14 = Matrix2f::determinant2x2(fVar15,m00_00,m00,fVar14);
  auVar4._4_4_ = extraout_XMM0_Db;
  auVar4._0_4_ = fVar6;
  auVar4._8_4_ = extraout_XMM0_Dc;
  auVar4._12_4_ = extraout_XMM0_Dd;
  auVar3._4_4_ = extraout_XMM0_Db_01;
  auVar3._0_4_ = fVar8;
  auVar3._8_4_ = extraout_XMM0_Dc_01;
  auVar3._12_4_ = extraout_XMM0_Dd_01;
  auVar1 = vfmsub231ss_fma(ZEXT416((uint)(fVar7 * m00_00)),auVar4,ZEXT416((uint)fVar15));
  auVar1 = vfmadd231ss_fma(auVar1,auVar3,ZEXT416((uint)m01));
  auVar5._8_4_ = 0x7fffffff;
  auVar5._0_8_ = 0x7fffffff7fffffff;
  auVar5._12_4_ = 0x7fffffff;
  auVar5 = vandps_avx512vl(auVar1,auVar5);
  if (epsilon <= auVar5._0_4_) {
    auVar17._0_8_ = CONCAT44(extraout_XMM0_Db_02,fVar9) ^ 0x8000000080000000;
    auVar17._8_4_ = extraout_XMM0_Dc_02 ^ 0x80000000;
    auVar17._12_4_ = extraout_XMM0_Dd_02 ^ 0x80000000;
    auVar16._0_8_ = CONCAT44(extraout_XMM0_Db_00,fVar7) ^ 0x8000000080000000;
    auVar16._8_4_ = extraout_XMM0_Dc_00 ^ 0x80000000;
    auVar16._12_4_ = extraout_XMM0_Dd_00 ^ 0x80000000;
    auVar18._0_8_ = CONCAT44(extraout_XMM0_Db_04,fVar11) ^ 0x8000000080000000;
    auVar18._8_4_ = extraout_XMM0_Dc_04 ^ 0x80000000;
    auVar18._12_4_ = extraout_XMM0_Dd_04 ^ 0x80000000;
    auVar19._0_8_ = CONCAT44(extraout_XMM0_Db_05,fVar13) ^ 0x8000000080000000;
    auVar19._8_4_ = extraout_XMM0_Dc_05 ^ 0x80000000;
    auVar19._12_4_ = extraout_XMM0_Dd_05 ^ 0x80000000;
    if (pbIsSingular != (bool *)0x0) {
      *pbIsSingular = false;
    }
    auVar2._4_4_ = extraout_XMM0_Db_03;
    auVar2._0_4_ = fVar10;
    auVar2._8_4_ = extraout_XMM0_Dc_03;
    auVar2._12_4_ = extraout_XMM0_Dd_03;
    auVar5 = vinsertps_avx(auVar4,auVar16,0x10);
    auVar5 = vinsertps_avx(auVar5,auVar3,0x20);
    auVar5 = vinsertps_avx(auVar5,auVar17,0x30);
    fVar15 = 1.0 / auVar1._0_4_;
    auVar1 = vinsertps_avx(auVar2,auVar18,0x10);
    auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)fVar12),0x20);
    auVar1 = vinsertps_avx(auVar1,auVar19,0x30);
    __return_storage_ptr__->m_elements[0] = fVar15 * auVar5._0_4_;
    __return_storage_ptr__->m_elements[1] = fVar15 * auVar5._4_4_;
    __return_storage_ptr__->m_elements[2] = fVar15 * auVar5._8_4_;
    __return_storage_ptr__->m_elements[3] = fVar15 * auVar5._12_4_;
    __return_storage_ptr__->m_elements[4] = fVar15 * auVar1._0_4_;
    __return_storage_ptr__->m_elements[5] = fVar15 * auVar1._4_4_;
    __return_storage_ptr__->m_elements[6] = fVar15 * auVar1._8_4_;
    __return_storage_ptr__->m_elements[7] = fVar15;
    __return_storage_ptr__->m_elements[8] = fVar15 * fVar14;
  }
  else {
    if (pbIsSingular != (bool *)0x0) {
      *pbIsSingular = true;
    }
    __return_storage_ptr__->m_elements[8] = 0.0;
    *(undefined1 (*) [32])__return_storage_ptr__->m_elements = ZEXT1232(ZEXT412(0));
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix3f Matrix3f::inverse( bool* pbIsSingular, float epsilon ) const
{
	float m00 = m_elements[ 0 ];
	float m10 = m_elements[ 1 ];
	float m20 = m_elements[ 2 ];

	float m01 = m_elements[ 3 ];
	float m11 = m_elements[ 4 ];
	float m21 = m_elements[ 5 ];

	float m02 = m_elements[ 6 ];
	float m12 = m_elements[ 7 ];
	float m22 = m_elements[ 8 ];

	float cofactor00 =  Matrix2f::determinant2x2( m11, m12, m21, m22 );
	float cofactor01 = -Matrix2f::determinant2x2( m10, m12, m20, m22 );
	float cofactor02 =  Matrix2f::determinant2x2( m10, m11, m20, m21 );

	float cofactor10 = -Matrix2f::determinant2x2( m01, m02, m21, m22 );
	float cofactor11 =  Matrix2f::determinant2x2( m00, m02, m20, m22 );
	float cofactor12 = -Matrix2f::determinant2x2( m00, m01, m20, m21 );

	float cofactor20 =  Matrix2f::determinant2x2( m01, m02, m11, m12 );
	float cofactor21 = -Matrix2f::determinant2x2( m00, m02, m10, m12 );
	float cofactor22 =  Matrix2f::determinant2x2( m00, m01, m10, m11 );

	float determinant = m00 * cofactor00 + m01 * cofactor01 + m02 * cofactor02;
	
	bool isSingular = ( fabs( determinant ) < epsilon );
	if( isSingular )
	{
		if( pbIsSingular != NULL )
		{
			*pbIsSingular = true;
		}
		return Matrix3f();
	}
	else
	{
		if( pbIsSingular != NULL )
		{
			*pbIsSingular = false;
		}

		float reciprocalDeterminant = 1.0f / determinant;

		return Matrix3f
		(
			cofactor00 * reciprocalDeterminant, cofactor10 * reciprocalDeterminant, cofactor20 * reciprocalDeterminant,
			cofactor01 * reciprocalDeterminant, cofactor11 * reciprocalDeterminant, cofactor21 * reciprocalDeterminant,
			cofactor02 * reciprocalDeterminant, cofactor12 * reciprocalDeterminant, cofactor22 * reciprocalDeterminant
		);
	}
}